

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::iterate
          (NegativeTexParameterCase *this)

{
  deUint32 *pdVar1;
  ostringstream *poVar2;
  TestLog *log;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  GLenum GVar5;
  GLenum GVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ulong uVar8;
  GLint param;
  glBindFragDataLocationFunc *pp_Var9;
  Functions *pFVar10;
  CallLogWrapper gl;
  Texture texture;
  ScopedLogSection scope;
  Enum<int,_2UL> local_1f0;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  Enum<int,_2UL> local_1d0;
  glBindFragDataLocationFunc local_1c0;
  long lStack_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Iteration","");
  local_1f0.m_getName = (GetNameFunc)&local_1e0;
  local_1f0.m_value = 0;
  local_1f0._12_4_ = 0;
  local_1e0 = (_func_char_ptr_int)0x0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  pp_Var9 = (glBindFragDataLocationFunc *)(plVar7 + 2);
  if ((glBindFragDataLocationFunc *)*plVar7 == pp_Var9) {
    local_1c0 = *pp_Var9;
    lStack_1b8 = plVar7[3];
    local_1d0.m_getName = (GetNameFunc)&local_1c0;
  }
  else {
    local_1c0 = *pp_Var9;
    local_1d0.m_getName = (GetNameFunc)*plVar7;
  }
  local_1d0._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  pdVar1 = &texture.super_ObjectWrapper.m_object;
  pFVar10 = (Functions *)(plVar7 + 2);
  if ((Functions *)*plVar7 == pFVar10) {
    texture.super_ObjectWrapper._16_8_ = pFVar10->activeShaderProgram;
    texture.super_ObjectWrapper.m_gl = (Functions *)pdVar1;
  }
  else {
    texture.super_ObjectWrapper._16_8_ = pFVar10->activeShaderProgram;
    texture.super_ObjectWrapper.m_gl = (Functions *)*plVar7;
  }
  texture.super_ObjectWrapper.m_traits = (ObjectTraits *)plVar7[1];
  *plVar7 = (long)pFVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&texture);
  pFVar10 = (Functions *)(plVar7 + 2);
  if ((Functions *)*plVar7 == pFVar10) {
    gl._16_8_ = pFVar10->activeShaderProgram;
    gl.m_gl = (Functions *)&gl.m_enableLog;
  }
  else {
    gl._16_8_ = pFVar10->activeShaderProgram;
    gl.m_gl = (Functions *)*plVar7;
  }
  gl.m_log = (TestLog *)plVar7[1];
  *plVar7 = (long)pFVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&scope,log,(string *)local_1b0,(string *)&gl);
  if (gl.m_gl != (Functions *)&gl.m_enableLog) {
    operator_delete(gl.m_gl,gl._16_8_ + 1);
  }
  if (texture.super_ObjectWrapper.m_gl != (Functions *)pdVar1) {
    operator_delete(texture.super_ObjectWrapper.m_gl,texture.super_ObjectWrapper._16_8_ + 1);
  }
  if ((glBindFragDataLocationFunc *)local_1d0.m_getName != &local_1c0) {
    operator_delete(local_1d0.m_getName,(ulong)(local_1c0 + 1));
  }
  if (local_1f0.m_getName != (GetNameFunc)&local_1e0) {
    operator_delete(local_1f0.m_getName,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3 && iterate::types[this->m_iteration].isArrayType == true) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_OES_texture_storage_multisample_2d_array");
    if (!bVar3) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "GL_OES_texture_storage_multisample_2d_array not supported, skipping target",0x4a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      goto LAB_015590f8;
    }
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar4),traits);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindTexture
            (&gl,iterate::types[this->m_iteration].target,texture.super_ObjectWrapper.m_object);
  iVar4 = this->m_iteration;
  if (iterate::types[iVar4].isArrayType == true) {
    glu::CallLogWrapper::glTexStorage3DMultisample
              (&gl,iterate::types[iVar4].target,1,iterate::types[iVar4].internalFormat,0x10,0x10,
               0x10,'\0');
  }
  else {
    glu::CallLogWrapper::glTexStorage2DMultisample
              (&gl,iterate::types[iVar4].target,1,iterate::types[iVar4].internalFormat,0x10,0x10,
               '\0');
  }
  GVar5 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar5,"setup texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x767);
  uVar8 = (ulong)this->m_texParam;
  param = 0;
  GVar5 = 0;
  if (uVar8 < 10) {
    GVar5 = *(GLenum *)(&DAT_01cacde8 + uVar8 * 4);
  }
  if (this->m_texParam < TEXTURE_LAST) {
    param = *(GLint *)(&DAT_01cace10 + uVar8 * 4);
  }
  glu::CallLogWrapper::glTexParameteri(&gl,iterate::types[this->m_iteration].target,GVar5,param);
  GVar6 = glu::CallLogWrapper::glGetError(&gl);
  GVar5 = 0;
  if ((ulong)this->m_texParam < 10) {
    GVar5 = *(GLenum *)(&DAT_01cace38 + (ulong)this->m_texParam * 4);
  }
  if (GVar6 != GVar5) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Got unexpected error: ",0x16);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", expected: ",0xc);
    iVar4 = 0;
    if ((ulong)this->m_texParam < 10) {
      iVar4 = *(int *)(&DAT_01cace38 + (ulong)this->m_texParam * 4);
    }
    local_1f0.m_getName = glu::getErrorName;
    local_1f0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got wrong error code");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
LAB_015590f8:
  iVar4 = this->m_iteration + 1;
  this->m_iteration = iVar4;
  tcu::TestLog::endSection(scope.m_log);
  return (IterateResult)(iVar4 < 6);
}

Assistant:

NegativeTexParameterCase::IterateResult NegativeTexParameterCase::iterate (void)
{
	static const struct TextureType
	{
		const char*	name;
		glw::GLenum	target;
		glw::GLenum	internalFormat;
		bool		isArrayType;
	} types[] =
	{
		{ "color",					GL_TEXTURE_2D_MULTISAMPLE,			GL_RGBA8,	false	},
		{ "color array",			GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_RGBA8,	true	},
		{ "signed integer",			GL_TEXTURE_2D_MULTISAMPLE,			GL_R8I,		false	},
		{ "signed integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8I,		true	},
		{ "unsigned integer",		GL_TEXTURE_2D_MULTISAMPLE,			GL_R8UI,	false	},
		{ "unsigned integer array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	GL_R8UI,	true	},
	};

	const tcu::ScopedLogSection scope(m_testCtx.getLog(), "Iteration", std::string() + "Testing parameter with " + types[m_iteration].name + " texture");
	const bool					supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (types[m_iteration].isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_OES_texture_storage_multisample_2d_array not supported, skipping target" << tcu::TestLog::EndMessage;
	else
	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		glu::Texture			texture	(m_context.getRenderContext());
		glw::GLenum				error;

		gl.enableLogging(true);

		// gen texture

		gl.glBindTexture(types[m_iteration].target, *texture);

		if (types[m_iteration].isArrayType)
			gl.glTexStorage3DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, 16, GL_FALSE);
		else
			gl.glTexStorage2DMultisample(types[m_iteration].target, 1, types[m_iteration].internalFormat, 16, 16, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup texture");

		// set param

		gl.glTexParameteri(types[m_iteration].target, getParamGLEnum(), getParamValue());
		error = gl.glGetError();

		// expect failure

		if (error != getExpectedError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Got unexpected error: " << glu::getErrorStr(error) << ", expected: " << glu::getErrorStr(getExpectedError()) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong error code");
		}
	}

	if (++m_iteration < DE_LENGTH_OF_ARRAY(types))
		return CONTINUE;
	return STOP;
}